

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * FixText(string *__return_storage_ptr__,TSpellCorrector *corrector,string *text)

{
  undefined1 local_60 [40];
  wstring input;
  string *text_local;
  TSpellCorrector *corrector_local;
  
  NJamSpell::UTF8ToWide((NJamSpell *)(local_60 + 0x20),text);
  NJamSpell::TSpellCorrector::FixFragment((TSpellCorrector *)local_60,(wstring *)corrector);
  NJamSpell::WideToUTF8(__return_storage_ptr__,(wstring *)local_60);
  std::__cxx11::wstring::~wstring((wstring *)local_60);
  std::__cxx11::wstring::~wstring((wstring *)(local_60 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string FixText(const NJamSpell::TSpellCorrector& corrector,
                    const std::string& text)
{
    std::wstring input = NJamSpell::UTF8ToWide(text);
    return NJamSpell::WideToUTF8(corrector.FixFragment(input));
}